

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

size_t absl::lts_20240722::cord_internal::CordzInfo::FillParentStack(CordzInfo *src,void **stack)

{
  size_t sVar1;
  void **__src;
  size_t *psVar2;
  
  if (stack != (void **)0x0) {
    if (src == (CordzInfo *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = src->parent_stack_depth_;
      if (sVar1 == 0) {
        sVar1 = src->stack_depth_;
        __src = src->stack_;
        psVar2 = &src->stack_depth_;
      }
      else {
        psVar2 = &src->parent_stack_depth_;
        __src = src->parent_stack_;
      }
      memcpy(stack,__src,sVar1 << 3);
      sVar1 = *psVar2;
    }
    return sVar1;
  }
  __assert_fail("stack",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0x128,
                "static size_t absl::cord_internal::CordzInfo::FillParentStack(const CordzInfo *, void **)"
               );
}

Assistant:

size_t CordzInfo::FillParentStack(const CordzInfo* src, void** stack) {
  assert(stack);
  if (src == nullptr) return 0;
  if (src->parent_stack_depth_) {
    memcpy(stack, src->parent_stack_, src->parent_stack_depth_ * sizeof(void*));
    return src->parent_stack_depth_;
  }
  memcpy(stack, src->stack_, src->stack_depth_ * sizeof(void*));
  return src->stack_depth_;
}